

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_simple.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  ALLEGRO_SAMPLE_ID sample_id;
  ALLEGRO_SAMPLE_ID new_sample_id;
  ALLEGRO_EVENT event;
  undefined8 local_e0;
  long local_d8;
  undefined8 local_d0;
  long local_c8 [10];
  int local_78 [8];
  int local_58;
  int local_54;
  uint local_50;
  
  cVar5 = al_install_system(0x85020700,atexit);
  if (cVar5 == '\0') {
    pcVar11 = "Could not init Allegro.\n";
  }
  else {
    if (argc < 2) {
      lVar7 = 0;
      log_printf("This example needs to be run from the command line.\nUsage: %s {audio_files}\n",
                 *argv);
LAB_001027b0:
      al_destroy_display(lVar7);
      return 0;
    }
    al_install_keyboard();
    lVar7 = al_create_display(0x280,0x1e0);
    if (lVar7 == 0) {
      pcVar11 = "Could not create display\n";
    }
    else {
      uVar8 = al_create_timer(0x11111111);
      al_start_timer(uVar8);
      uVar9 = al_create_event_queue();
      uVar10 = al_get_keyboard_event_source();
      al_register_event_source(uVar9,uVar10);
      local_d8 = lVar7;
      uVar10 = al_get_display_event_source(lVar7);
      al_register_event_source(uVar9,uVar10);
      uVar8 = al_get_timer_event_source(uVar8);
      al_register_event_source(uVar9,uVar8);
      al_init_acodec_addon();
      cVar5 = al_install_audio();
      if (cVar5 != '\0') {
        uVar12 = 9;
        if (argc - 2U < 9) {
          uVar12 = argc - 2U;
        }
        bVar14 = false;
        bVar3 = false;
        do {
          cVar5 = al_reserve_samples(0x10);
          if (cVar5 == '\0') {
            pcVar11 = "Could not set up voice and mixer.\n";
            goto LAB_001027e5;
          }
          local_c8[8] = 0;
          local_c8[9] = 0;
          local_c8[6] = 0;
          local_c8[7] = 0;
          local_c8[4] = 0;
          local_c8[5] = 0;
          local_c8[2] = 0;
          local_c8[3] = 0;
          local_c8[0] = 0;
          local_c8[1] = 0;
          uVar13 = 0;
          do {
            pcVar11 = argv[uVar13 + 1];
            lVar7 = al_load_sample(pcVar11);
            local_c8[uVar13] = lVar7;
            if (lVar7 == 0) {
              log_printf("Could not load sample from \'%s\'!\n",pcVar11);
            }
            uVar13 = uVar13 + 1;
          } while (uVar12 + 1 != uVar13);
          log_printf(
                    "Press digits to play sounds.\nSpace to stop sounds.\nAdd Alt to play sounds repeatedly.\n\'p\' to pan the last played sound.\nEscape to quit.\n"
                    );
          do {
            do {
              while( true ) {
                al_wait_for_event(uVar9,local_78);
                lVar7 = local_d8;
                if (local_78[0] != 0x1e) break;
                if ((bVar14) && (bVar3)) {
                  lVar7 = al_lock_sample_id(&local_e0);
                  if (lVar7 != 0) {
                    dVar1 = (double)al_get_time();
                    dVar1 = sin(dVar1);
                    al_set_sample_instance_pan((float)dVar1,lVar7);
                  }
                  al_unlock_sample_id(&local_e0);
                }
              }
              if (local_78[0] == 0x2a) {
LAB_0010277d:
                uVar13 = 0;
                do {
                  if (local_c8[uVar13] != 0) {
                    al_destroy_sample();
                  }
                } while (((long)(uVar13 + 1) < (long)(argc + -1)) &&
                        (bVar14 = uVar13 < 9, uVar13 = uVar13 + 1, bVar14));
                al_uninstall_audio();
                goto LAB_001027b0;
              }
            } while (local_78[0] != 0xb);
            if (local_58 == 0x3b) goto LAB_0010277d;
            if (local_54 == 0x20) {
              log_printf("Stopping all sounds\n");
              al_stop_samples();
            }
            uVar4 = local_50;
            if (local_54 - 0x30U < 10) {
              uVar2 = local_54 - 0x31;
              if (local_54 - 0x27U < 10) {
                uVar2 = local_54 - 0x27U;
              }
              if (local_c8[uVar2] != 0) {
                cVar5 = al_play_sample(0x3f800000,0,0x3f800000,local_c8[uVar2],
                                       0x101 - (uint)((local_50 & 4) == 0),&local_d0);
                if (cVar5 == '\0') {
                  log_printf("al_play_sample_data failed, perhaps too many sounds\n");
                }
                else {
                  pcVar11 = "repeatedly";
                  if ((uVar4 & 4) == 0) {
                    pcVar11 = "once";
                  }
                  log_printf("Playing %d %s\n",(ulong)uVar2,pcVar11);
                  if (!bVar14) {
                    local_e0 = local_d0;
                    bVar3 = true;
                  }
                }
                goto LAB_0010270a;
              }
            }
            else {
LAB_0010270a:
              if ((local_54 == 0x70) && (bVar3)) {
                pcVar11 = "Panning\n";
                if (bVar14) {
                  pcVar11 = "Not panning\n";
                }
                log_printf(pcVar11);
                bVar14 = (bool)(bVar14 ^ 1);
              }
            }
          } while (local_54 != 0x72);
          uVar13 = 0;
          do {
            if (local_c8[uVar13] != 0) {
              al_destroy_sample();
            }
            uVar13 = uVar13 + 1;
          } while (uVar12 + 1 != uVar13);
          al_uninstall_audio();
          cVar5 = al_install_audio();
        } while (cVar5 != '\0');
      }
      pcVar11 = "Could not init sound!\n";
    }
  }
LAB_001027e5:
  abort_example(pcVar11);
  iVar6 = __cxa_atexit();
  return iVar6;
}

Assistant:

int main(int argc, const char *argv[])
{
   ALLEGRO_SAMPLE *sample_data[MAX_SAMPLE_DATA] = {NULL};
   ALLEGRO_DISPLAY *display = NULL;
   ALLEGRO_EVENT_QUEUE *event_queue;
   ALLEGRO_EVENT event;
   ALLEGRO_SAMPLE_ID sample_id;
   bool sample_id_valid = false;
   ALLEGRO_TIMER* timer;
   int i;
   bool panning = false;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 2) {
      log_printf("This example needs to be run from the command line.\nUsage: %s {audio_files}\n", argv[0]);
      goto done;
   }
   argc--;
   argv++;

   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Could not create display\n");
   }

   timer = al_create_timer(1/60.0);
   al_start_timer(timer);
   event_queue = al_create_event_queue();
   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_display_event_source(display));
   al_register_event_source(event_queue, al_get_timer_event_source(timer));

   al_init_acodec_addon();

Restart:

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   if (!al_reserve_samples(RESERVED_SAMPLES)) {
      abort_example("Could not set up voice and mixer.\n");
   }

   memset(sample_data, 0, sizeof(sample_data));
   for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
      const char *filename = argv[i];

      /* Load the entire sound file from disk. */
      sample_data[i] = al_load_sample(argv[i]);
      if (!sample_data[i]) {
         log_printf("Could not load sample from '%s'!\n", filename);
         continue;
      }
   }

   log_printf(
      "Press digits to play sounds.\n"
      "Space to stop sounds.\n"
      "Add Alt to play sounds repeatedly.\n"
      "'p' to pan the last played sound.\n"
      "Escape to quit.\n");

   while (true) {
      al_wait_for_event(event_queue, &event);
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         if (event.keyboard.unichar == ' ') {
            log_printf("Stopping all sounds\n");
            al_stop_samples();
         }

         if (event.keyboard.unichar >= '0' && event.keyboard.unichar <= '9') {
            bool loop = event.keyboard.modifiers & ALLEGRO_KEYMOD_ALT;
            i = (event.keyboard.unichar - '0' + 9) % 10;
            if (sample_data[i]) {
               ALLEGRO_SAMPLE_ID new_sample_id;
               bool ret = al_play_sample(sample_data[i], 1.0, 0.0, 1.0,
                  loop ? ALLEGRO_PLAYMODE_LOOP : ALLEGRO_PLAYMODE_ONCE, &new_sample_id);
               if (ret) {
                  log_printf("Playing %d %s\n", i, loop ? "repeatedly" : "once");
               }
               else {
                  log_printf(
                     "al_play_sample_data failed, perhaps too many sounds\n");
               }
               if (!panning) {
                  if (ret) {
                     sample_id = new_sample_id;
                     sample_id_valid = true;
                  }
               }
            }
         }

         if (event.keyboard.unichar == 'p') {
            if (sample_id_valid) {
               panning = !panning;
               if (panning) {
                  log_printf("Panning\n");
               }
               else {
                  log_printf("Not panning\n");
               }
            }
         }

         /* Hidden feature: restart audio subsystem.
          * For debugging race conditions on shutting down the audio.
          */
         if (event.keyboard.unichar == 'r') {
            for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
               if (sample_data[i])
                  al_destroy_sample(sample_data[i]);
            }
            al_uninstall_audio();
            goto Restart;
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         if (panning && sample_id_valid) {
            ALLEGRO_SAMPLE_INSTANCE* instance = al_lock_sample_id(&sample_id);
            if (instance) {
               al_set_sample_instance_pan(instance, sin(al_get_time()));
            }
            al_unlock_sample_id(&sample_id);
         }
      }
   }

   for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
      if (sample_data[i])
         al_destroy_sample(sample_data[i]);
   }

   /* Sample data and other objects will be automatically freed. */
   al_uninstall_audio();

done:
   al_destroy_display(display);
   close_log(false);
   return 0;
}